

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PaddingLayerParams::PaddingLayerParams
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  uint32_t uVar1;
  ulong uVar2;
  BorderAmounts *from_00;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingConstant *this_01;
  PaddingLayerParams_PaddingReflection *this_02;
  PaddingLayerParams_PaddingReplication *this_03;
  undefined1 *puVar3;
  Arena *pAVar4;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PaddingLayerParams_004b5bd0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  from_00 = from->paddingamounts_;
  if (from_00 == (BorderAmounts *)0x0 ||
      from == (PaddingLayerParams *)_PaddingLayerParams_default_instance_) {
    this_00 = (BorderAmounts *)0x0;
  }
  else {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from_00);
  }
  this->paddingamounts_ = this_00;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 3) {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 3;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_03 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingReplication>
                        (pAVar4);
    (this->PaddingType_).replication_ = this_03;
    if (from->_oneof_case_[0] == 3) {
      puVar3 = (undefined1 *)(from->PaddingType_).replication_;
    }
    else {
      puVar3 = _PaddingLayerParams_PaddingReplication_default_instance_;
    }
    PaddingLayerParams_PaddingReplication::MergeFrom
              (this_03,(PaddingLayerParams_PaddingReplication *)puVar3);
  }
  else if (uVar1 == 2) {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 2;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_02 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingReflection>
                        (pAVar4);
    (this->PaddingType_).reflection_ = this_02;
    if (from->_oneof_case_[0] == 2) {
      puVar3 = (undefined1 *)(from->PaddingType_).reflection_;
    }
    else {
      puVar3 = _PaddingLayerParams_PaddingReflection_default_instance_;
    }
    PaddingLayerParams_PaddingReflection::MergeFrom
              (this_02,(PaddingLayerParams_PaddingReflection *)puVar3);
  }
  else if (uVar1 == 1) {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 1;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>(pAVar4);
    (this->PaddingType_).constant_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      puVar3 = (undefined1 *)(from->PaddingType_).constant_;
    }
    else {
      puVar3 = _PaddingLayerParams_PaddingConstant_default_instance_;
    }
    PaddingLayerParams_PaddingConstant::MergeFrom
              (this_01,(PaddingLayerParams_PaddingConstant *)puVar3);
  }
  return;
}

Assistant:

PaddingLayerParams::PaddingLayerParams(const PaddingLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_paddingamounts()) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts(*from.paddingamounts_);
  } else {
    paddingamounts_ = nullptr;
  }
  clear_has_PaddingType();
  switch (from.PaddingType_case()) {
    case kConstant: {
      _internal_mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from._internal_constant());
      break;
    }
    case kReflection: {
      _internal_mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from._internal_reflection());
      break;
    }
    case kReplication: {
      _internal_mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from._internal_replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PaddingLayerParams)
}